

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso3.c
# Opt level: O1

void Gia_Iso3Compute(Gia_Man_t *p,Vec_Int_t *vSign)

{
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  if (0 < p->nObjs) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return;
      }
      pObj = (Gia_Obj_t *)(&pGVar1->field_0x0 + lVar4);
      uVar2 = *(ulong *)pObj & 0x1fffffff;
      if (uVar2 != 0x1fffffff) {
        Gia_Iso3ComputeEdge(p,pObj,(Gia_Obj_t *)
                                   (lVar4 + (ulong)(uint)((int)uVar2 << 2) * -3 + (long)pGVar1),
                            (uint)(*(ulong *)pObj >> 0x1d) & 1,vSign);
      }
      uVar2 = *(ulong *)pObj;
      if ((~(uint)uVar2 & 0x1fffffff) != 0 && -1 < (int)(uint)uVar2) {
        Gia_Iso3ComputeEdge(p,pObj,(Gia_Obj_t *)
                                   ((long)pGVar1 +
                                   lVar4 + (ulong)((uint)(uVar2 >> 0x1e) & 0x7ffffffc) * -3),
                            (uint)(uVar2 >> 0x3d) & 1,vSign);
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0xc;
    } while (lVar3 < p->nObjs);
  }
  return;
}

Assistant:

void Gia_Iso3Compute( Gia_Man_t * p, Vec_Int_t * vSign )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) )
            Gia_Iso3ComputeEdge( p, pObj, Gia_ObjFanin0(pObj), Gia_ObjFaninC0(pObj), vSign );
        if ( Gia_ObjIsAnd(pObj) )
            Gia_Iso3ComputeEdge( p, pObj, Gia_ObjFanin1(pObj), Gia_ObjFaninC1(pObj), vSign );
    }
}